

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-split.cpp
# Opt level: O1

void __thiscall
split_strategy::split_strategy
          (split_strategy *this,split_params *params,ifstream *f_input,gguf_context *ctx_gguf,
          ggml_context *ctx_meta)

{
  pointer *pppgVar1;
  pointer pcVar2;
  iterator __position;
  pointer ppgVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  split_mode sVar6;
  undefined2 uVar7;
  bool bVar8;
  int iVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  gguf_context **ctx;
  pointer ppgVar15;
  gguf_context *ctx_out;
  vector<gguf_context_*,_std::allocator<gguf_context_*>_> *__range1;
  int i_split;
  anon_class_32_4_220f47be new_ctx_out;
  gguf_context *local_70;
  gguf_context *local_68;
  vector<gguf_context*,std::allocator<gguf_context*>> *local_60;
  int local_54;
  anon_class_32_4_220f47be local_50;
  
  (this->params).n_split_tensors = params->n_split_tensors;
  sVar6 = params->mode;
  uVar7 = *(undefined2 *)&params->field_0x2;
  uVar4 = *(undefined4 *)&params->field_0x4;
  sVar14 = params->n_bytes_split;
  uVar5 = *(undefined4 *)((long)&params->n_bytes_split + 4);
  (this->params).operation = params->operation;
  (this->params).mode = sVar6;
  *(undefined2 *)&(this->params).field_0x2 = uVar7;
  *(undefined4 *)&(this->params).field_0x4 = uVar4;
  *(int *)&(this->params).n_bytes_split = (int)sVar14;
  *(undefined4 *)((long)&(this->params).n_bytes_split + 4) = uVar5;
  (this->params).input._M_dataplus._M_p = (pointer)&(this->params).input.field_2;
  pcVar2 = (params->input)._M_dataplus._M_p;
  local_68 = ctx_gguf;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->params).input,pcVar2,pcVar2 + (params->input)._M_string_length);
  (this->params).output._M_dataplus._M_p = (pointer)&(this->params).output.field_2;
  pcVar2 = (params->output)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->params).output,pcVar2,pcVar2 + (params->output)._M_string_length);
  bVar8 = params->dry_run;
  (this->params).no_tensor_first_split = params->no_tensor_first_split;
  (this->params).dry_run = bVar8;
  this->f_input = f_input;
  this->ctx_gguf = local_68;
  this->ctx_meta = ctx_meta;
  iVar9 = gguf_get_n_tensors();
  this->n_tensors = iVar9;
  local_60 = (vector<gguf_context*,std::allocator<gguf_context*>> *)&this->ctx_outs;
  (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.i_split = &local_54;
  local_54 = -1;
  local_50.ctx_out = &local_70;
  local_70 = (gguf_context *)0x0;
  local_50.ctx_gguf = &local_68;
  local_50.this = this;
  split_strategy::anon_class_32_4_220f47be::operator()(&local_50,false);
  if (params->no_tensor_first_split == true) {
    split_strategy::anon_class_32_4_220f47be::operator()(&local_50,true);
  }
  if (0 < this->n_tensors) {
    lVar13 = 0;
    sVar14 = 0;
    do {
      uVar10 = gguf_get_tensor_name(local_68,lVar13);
      uVar10 = ggml_get_tensor(ctx_meta,uVar10);
      lVar11 = ggml_nbytes(uVar10);
      uVar12 = lVar11 + 0x1fU & 0xffffffffffffffe0;
      sVar14 = sVar14 + uVar12;
      bVar8 = should_split(this,(int)lVar13,sVar14);
      if (bVar8) {
        split_strategy::anon_class_32_4_220f47be::operator()(&local_50,false);
        sVar14 = uVar12;
      }
      gguf_add_tensor(local_70,uVar10);
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->n_tensors);
  }
  __position._M_current =
       (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<gguf_context*,std::allocator<gguf_context*>>::_M_realloc_insert<gguf_context*const&>
              (local_60,__position,&local_70);
  }
  else {
    *__position._M_current = local_70;
    pppgVar1 = &(this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppgVar1 = *pppgVar1 + 1;
  }
  ppgVar3 = (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppgVar15 = (this->ctx_outs).
                  super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppgVar15 != ppgVar3; ppgVar15 = ppgVar15 + 1) {
    gguf_set_val_u16(*ppgVar15,"split.count",
                     (uint)(*(int *)&(this->ctx_outs).
                                     super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->ctx_outs).
                                    super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff);
  }
  return;
}

Assistant:

split_strategy(const split_params & params,
            std::ifstream & f_input,
            struct gguf_context * ctx_gguf,
            struct ggml_context * ctx_meta) :
        params(params),
        f_input(f_input),
        ctx_gguf(ctx_gguf),
        ctx_meta(ctx_meta),
        n_tensors(gguf_get_n_tensors(ctx_gguf)) {

        // because we need to know list of tensors for each file in advance, we will build all the ctx_out for all output splits
        int i_split = -1;
        struct gguf_context * ctx_out = NULL;
        auto new_ctx_out = [&](bool allow_no_tensors) {
            i_split++;
            if (ctx_out != NULL) {
                if (gguf_get_n_tensors(ctx_out) == 0 && !allow_no_tensors) {
                    fprintf(stderr, "error: one of splits have 0 tensors. Maybe size or tensors limit is too small\n");
                    exit(EXIT_FAILURE);
                }
                ctx_outs.push_back(ctx_out);
            }
            ctx_out = gguf_init_empty();
            // Save all metadata in first split only
            if (i_split == 0) {
                gguf_set_kv(ctx_out, ctx_gguf);
            }
            gguf_set_val_u16(ctx_out, LLM_KV_SPLIT_NO, i_split);
            gguf_set_val_u16(ctx_out, LLM_KV_SPLIT_COUNT, 0); // placeholder
            gguf_set_val_i32(ctx_out, LLM_KV_SPLIT_TENSORS_COUNT, n_tensors);
        };

        // initialize ctx_out for the first split
        new_ctx_out(false);

        // skip first split if no_tensor_first_split is set
        if (params.no_tensor_first_split) {
            new_ctx_out(true);
        }

        // process tensors one by one
        size_t curr_tensors_size = 0; // current size by counting only tensors size (without metadata)
        for (int i = 0; i < n_tensors; ++i) {
            struct ggml_tensor * t = ggml_get_tensor(ctx_meta, gguf_get_tensor_name(ctx_gguf, i));
            // calculate the "imaginary" size = the current size + next tensor size
            size_t n_bytes = GGML_PAD(ggml_nbytes(t), GGUF_DEFAULT_ALIGNMENT);
            size_t next_tensors_size = curr_tensors_size + n_bytes;
            if (should_split(i, next_tensors_size)) {
                new_ctx_out(false);
                curr_tensors_size = n_bytes;
            } else {
                curr_tensors_size = next_tensors_size;
            }
            gguf_add_tensor(ctx_out, t);
        }

        // push the last ctx_out
        ctx_outs.push_back(ctx_out);

        // set the correct n_split for all ctx_out
        for (auto & ctx : ctx_outs) {
            gguf_set_val_u16(ctx, LLM_KV_SPLIT_COUNT, ctx_outs.size());
        }
    }